

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LogErrorCase::expectMessage
          (LogErrorCase *this,GLenum source,GLenum type)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  undefined8 uVar8;
  undefined4 extraout_var_00;
  MessageBuilder local_550;
  int local_3cc;
  undefined1 local_3c8 [4];
  int msgLen;
  allocator<char> local_241;
  string local_240;
  MessageBuilder local_220;
  allocator<char> local_99;
  string local_98;
  undefined4 local_64;
  undefined1 local_60 [8];
  MessageData lastMsg;
  TestLog *log;
  long lStack_20;
  int numMsg;
  Functions *gl;
  GLenum type_local;
  GLenum source_local;
  LogErrorCase *this_local;
  
  gl._0_4_ = type;
  gl._4_4_ = source;
  _type_local = this;
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  log._4_4_ = 0;
  lastMsg.message.field_2._8_8_ =
       tcu::TestContext::getLog
                 ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  MessageData::MessageData((MessageData *)local_60);
  if ((gl._4_4_ == 0x1100) || ((GLenum)gl == 0x1100)) {
    local_64 = 1;
  }
  else {
    (**(code **)(lStack_20 + 0x868))(0x9145,(long)&log + 4);
    if (log._4_4_ == 0) {
      bVar2 = BaseCase::isDebugContext(&this->super_BaseCase);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Error was not reported as expected",&local_99);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        tcu::TestLog::operator<<
                  (&local_220,(TestLog *)lastMsg.message.field_2._8_8_,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_220,
                            (char (*) [65])
                            "A message was expected but none was reported (empty message log)");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_220);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"Verification accuracy is lacking without a debug context",
                   &local_241);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator(&local_241);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_3c8,(TestLog *)lastMsg.message.field_2._8_8_,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_3c8,
                            (char (*) [98])
                            "A message was expected but none was reported (empty message log). Running without a debug context"
                           );
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3c8);
      }
      local_64 = 1;
    }
    else {
      if (1 < log._4_4_) {
        (**(code **)(lStack_20 + 0x7e0))(log._4_4_ + -1,0,0,0,0,0,0,0);
      }
      local_3cc = 0;
      (**(code **)(lStack_20 + 0x868))(0x8243,&local_3cc);
      do {
        dVar4 = ::deGetFalse();
        if ((dVar4 != 0) || (local_3cc < 0)) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Negative message length","msgLen >= 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                     ,0x316);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      do {
        dVar4 = ::deGetFalse();
        if ((dVar4 != 0) || (99999 < local_3cc)) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Excessively long message","msgLen < 100000",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                     ,0x317);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      std::__cxx11::string::resize((ulong)&lastMsg.id.id);
      iVar3 = local_3cc;
      pcVar1 = *(code **)(lStack_20 + 0x7e0);
      uVar8 = std::__cxx11::string::operator[]((ulong)&lastMsg.id.id);
      (*pcVar1)(1,iVar3,local_60,local_60 + 4,&lastMsg,&lastMsg.id.type,&local_3cc,uVar8);
      tcu::TestLog::operator<<
                (&local_550,(TestLog *)lastMsg.message.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_550,(char (*) [15])"Driver says: \"");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&lastMsg.id.id);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b3d55e);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_550);
      BaseCase::verifyMessage(&this->super_BaseCase,(MessageData *)local_60,gl._4_4_,(GLenum)gl);
      pRVar5 = gles31::Context::getRenderContext
                         ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
      iVar3 = (*pRVar5->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
      local_64 = 0;
    }
  }
  MessageData::~MessageData((MessageData *)local_60);
  return;
}

Assistant:

void LogErrorCase::expectMessage (GLenum source, GLenum type)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	int						numMsg		= 0;
	TestLog&				log			= m_testCtx.getLog();
	MessageData				lastMsg;

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	if (numMsg == 0)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Error was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported (empty message log)" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported (empty message log). Running without a debug context" << TestLog::EndMessage;
		}
		return;
	}

	// There may be messages other than the error we are looking for in the log.
	// Strictly nothing prevents the implementation from producing more than the
	// required error from an API call with a defined error. however we assume that
	// since calls that produce an error should not change GL state the implementation
	// should have nothing else to report.
	if (numMsg > 1)
		gl.getDebugMessageLog(numMsg-1, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL); // Clear all but last

	{
		int  msgLen = 0;
		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		lastMsg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &lastMsg.id.source, &lastMsg.id.type, &lastMsg.id.id, &lastMsg.severity, &msgLen, &lastMsg.message[0]);
	}

	log << TestLog::Message << "Driver says: \"" << lastMsg.message << "\"" << TestLog::EndMessage;

	verifyMessage(lastMsg, source, type);

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}